

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
AddProperty<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance,JavascriptString *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  Var pvVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_00;
  BigSimpleDictionaryTypeHandler *this_01;
  SimpleDictionaryPropertyDescriptor<int> *pSVar9;
  JavascriptString **ppJVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int index_00;
  undefined4 uVar11;
  undefined7 in_register_00000081;
  JavascriptString *local_68;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  Var local_58;
  ScriptContext *local_50;
  undefined4 local_48;
  uint local_44;
  JavascriptString *local_40;
  JavascriptString *propertyKey_local;
  int index;
  
  local_50 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)info;
  local_40 = propertyKey;
  bVar5 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::JavascriptString*>
                    (*(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                       **)(this + 0x18),&local_40,
                     (SimpleDictionaryPropertyDescriptor<int> **)&local_68);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))",
                                "!propertyMap->TryGetReference(propertyKey, &descriptor)");
    if (!bVar5) goto LAB_00c9b65e;
    *puVar8 = 0;
  }
  local_44 = (uint)CONCAT71(in_register_00000081,attributes);
  if (((byte)this[9] & 4) == 0) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar5) goto LAB_00c9b65e;
        *puVar8 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
  }
  else {
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)
              SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
              ConvertToNonSharedSimpleDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this
                         ,instance);
  }
  TPropertyKey_IsInternalPropertyId(local_40);
  if (*(int *)(this + 0xc) <= *(int *)(this + 0x2c)) {
    if (0x3ffffffe < *(int *)(this + 0xc)) {
      this_01 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
                ConvertToBigSimpleDictionaryTypeHandler
                          ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
                           this,instance);
      BVar6 = AddProperty<Js::JavascriptString*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_01
                         ,instance,local_40,value,(PropertyAttributes)local_44,
                         (PropertyValueInfo *)descriptor,flags,possibleSideEffects);
      return BVar6;
    }
    SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::EnsureSlotCapacity
              (&this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>,
               instance);
  }
  if (value == (Var)0x0 && (char)((flags & PropertyOperation_SpecialValue) >> 4) == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar5) goto LAB_00c9b65e;
    *puVar8 = 0;
  }
  if (((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
       super_DynamicTypeHandler.flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar5) goto LAB_00c9b65e;
    *puVar8 = 0;
  }
  pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
           singletonInstance.ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab1,
                                "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                ,
                                "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                               );
    if (!bVar5) goto LAB_00c9b65e;
    *puVar8 = 0;
  }
  local_58 = value;
  if (((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
       (TPropertyKey_IsInternalPropertyId(local_40), pvVar4 = local_58,
       (flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
       PropertyOperation_None)) &&
      (pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>)
                .singletonInstance.ptr, pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0))
     && ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance)) {
    bVar5 = VarIs<Js::JavascriptFunction>(local_58);
    if (bVar5) {
      bVar5 = DynamicTypeHandler::ShouldFixMethodProperties();
      uVar11 = (undefined4)CONCAT71(extraout_var,bVar5);
    }
    else {
      bVar5 = DynamicTypeHandler::ShouldFixDataProperties();
      if (bVar5) {
        bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_40,pvVar4);
        uVar11 = (undefined4)CONCAT71(extraout_var_00,bVar5);
      }
      else {
        uVar11 = 0;
      }
    }
  }
  else {
    uVar11 = 0;
  }
  if ((((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
        field_0x28 & 2) == 0) ||
     (local_48 = uVar11,
     bVar5 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
             TryReuseDeletedPropertyIndex(this_00,instance,(int *)((long)&propertyKey_local + 4)),
     uVar11 = local_48, !bVar5)) {
    uVar7 = local_44;
    propertyKey_local._4_4_ = *(int *)(this + 0x2c);
    Add<Js::JavascriptString*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_00,local_40,
               (PropertyAttributes)local_44,
               (flags & PropertyOperation_PreInit) == PropertyOperation_None,SUB41(uVar11,0),false,
               local_50);
  }
  else {
    pSVar9 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this_00->
                          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>)
                          .propertyMap.ptr,propertyKey_local._4_4_);
    index_00 = pSVar9->propertyIndex;
    if (pSVar9->propertyIndex != propertyKey_local._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xac0,
                                  "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                  ,
                                  "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                 );
      if (!bVar5) {
LAB_00c9b65e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      index_00 = propertyKey_local._4_4_;
    }
    ppJVar10 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt((this_00->
                          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>)
                          .propertyMap.ptr,index_00);
    local_68 = *ppJVar10;
    JsUtil::
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Remove((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
             propertyMap.ptr,&local_68);
    uVar7 = local_44;
    Add<Js::JavascriptString*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_00,
               propertyKey_local._4_4_,local_40,(PropertyAttributes)local_44,
               (flags & PropertyOperation_PreInit) == PropertyOperation_None,local_48._0_1_,false,
               local_50);
  }
  pvVar4 = local_58;
  if ((uVar7 & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,propertyKey_local._4_4_,pvVar4);
  if (descriptor != (SimpleDictionaryPropertyDescriptor<int> *)0x0) {
    *descriptor = (SimpleDictionaryPropertyDescriptor<int>)instance;
    *(undefined4 *)(descriptor + 1) = 0xffff;
  }
  uVar7 = TPropertyKey_GetOptionalPropertyId<Js::JavascriptString*>(local_50,local_40);
  if (uVar7 != 0xffffffff) {
    if ((((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
          super_DynamicTypeHandler.flags & 0x20) != 0) ||
       ((0xf < uVar7 &&
        (BVar6 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           (&instance->super_RecyclableObject,uVar7), BVar6 != 0)))) {
      ScriptContext::InvalidateProtoCaches(local_50,uVar7);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,uVar7,local_58,possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }